

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_g_Module.cpp
# Opt level: O1

bool __thiscall axl::g::Module::addFinalizer(Module *this,Ptr<axl::g::Finalizer> *finalizer)

{
  size_t *psVar1;
  FinalizerEntry *pFVar2;
  FinalizerEntry *pFVar3;
  FinalizerEntry *pFVar4;
  ListLink *link;
  
  pFVar3 = (FinalizerEntry *)operator_new(0x20);
  (pFVar3->m_finalizer).m_p = (Finalizer *)0x0;
  (pFVar3->m_finalizer).m_refCount = (RefCount *)0x0;
  rc::Ptr<axl::g::Finalizer>::copy
            (&pFVar3->m_finalizer,(EVP_PKEY_CTX *)finalizer->m_p,
             (EVP_PKEY_CTX *)finalizer->m_refCount);
  pthread_mutex_lock((pthread_mutex_t *)&this->m_finalizerListLock);
  pFVar2 = (this->m_finalizerList).
           super_OwningListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::g::Module::FinalizerEntry>_>
           .
           super_ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
           .super_ListData<axl::g::Module::FinalizerEntry>.m_tail;
  (pFVar3->super_ListLink).m_next = (ListLink *)0x0;
  (pFVar3->super_ListLink).m_prev = &pFVar2->super_ListLink;
  pFVar4 = (FinalizerEntry *)&this->m_finalizerList;
  if (pFVar2 != (FinalizerEntry *)0x0) {
    pFVar4 = pFVar2;
  }
  (pFVar4->super_ListLink).m_next = (ListLink *)pFVar3;
  (this->m_finalizerList).
  super_OwningListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::g::Module::FinalizerEntry>_>
  .
  super_ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
  .super_ListData<axl::g::Module::FinalizerEntry>.m_tail = pFVar3;
  psVar1 = &(this->m_finalizerList).
            super_OwningListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::g::Module::FinalizerEntry>_>
            .
            super_ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
            .super_ListData<axl::g::Module::FinalizerEntry>.m_count;
  *psVar1 = *psVar1 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_finalizerListLock);
  return true;
}

Assistant:

bool
Module::addFinalizer(const rc::Ptr<Finalizer>& finalizer) {
	FinalizerEntry* finalizerEntry = new FinalizerEntry;
	finalizerEntry->m_finalizer = finalizer;

	m_finalizerListLock.lock();
	m_finalizerList.insertTail(finalizerEntry);
	m_finalizerListLock.unlock();
	return true;
}